

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPort::IfcPort(IfcPort *this,void **vtt)

{
  void **vtt_local;
  IfcPort *this_local;
  
  IfcProduct::IfcProduct(&this->super_IfcProduct,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPort,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPort,_0UL> *)
             &(this->super_IfcProduct).field_0x100,vtt + 0x17);
  *(void **)&(this->super_IfcProduct).super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcProduct).super_IfcObject + -0x18)) = vtt[0x19];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcProduct).field_0x100 = vtt[0x1d];
  return;
}

Assistant:

IfcPort() : Object("IfcPort") {}